

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O2

bool libwebm::vttdemux::WriteChaptersCuePayload(FILE *f,Display *display)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  string line;
  ChapterAtomParser parser;
  string local_70;
  ChapterAtomParser local_50;
  
  ChapterAtomParser::ChapterAtomParser(&local_50,display);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  iVar4 = 0;
  do {
    iVar1 = libwebvtt::LineReader::GetLine(&local_50.super_LineReader,&local_70);
    if (iVar1 < 0) goto LAB_0010ede4;
    if (local_70._M_string_length == 0) {
      bVar3 = 1;
      goto LAB_0010edeb;
    }
    uVar2 = fprintf((FILE *)f,"%s\n",local_70._M_dataplus._M_p);
    iVar4 = iVar4 + 1;
  } while (-1 < (int)uVar2);
  iVar4 = (iVar4 - ((int)~uVar2 >> 0x1f)) + -1;
LAB_0010ede4:
  bVar3 = 0;
LAB_0010edeb:
  std::__cxx11::string::~string((string *)&local_70);
  libwebvtt::Parser::~Parser((Parser *)&local_50);
  return (bool)(0 < iVar4 & bVar3);
}

Assistant:

bool vttdemux::WriteChaptersCuePayload(
    FILE* f, const mkvparser::Chapters::Display* display) {
  // Bind a Chapter parser object to the display, which allows us to
  // extract each line of text from the title-part of the display.
  ChapterAtomParser parser(display);

  int count = 0;  // count of lines of payload text written to output file
  for (string line;;) {
    const int e = parser.GetLine(&line);

    if (e < 0)  // error (only -- we allow EOS here)
      return false;

    if (line.empty())  // TODO(matthewjheaney): retain this check?
      break;

    if (fprintf(f, "%s\n", line.c_str()) < 0)
      return false;

    ++count;
  }

  if (count <= 0)  // WebVTT cue requires non-empty payload
    return false;

  return true;
}